

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O3

void DepParserTask::get_eager_action_cost(search *sch,uint32_t idx,uint64_t n)

{
  int *piVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  
  pvVar3 = sch->task_data;
  lVar4 = *(long *)((long)pvVar3 + 0x98);
  lVar5 = *(long *)((long)pvVar3 + 0xa0);
  if (lVar5 - lVar4 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = (ulong)*(uint *)(lVar5 + -4);
  }
  lVar10 = lVar5 - lVar4 >> 2;
  lVar11 = *(long *)((long)pvVar3 + 0xb8);
  lVar8 = 0;
  do {
    *(undefined4 *)(*(long *)((long)pvVar3 + 0x38) + 4 + lVar8 * 4) = 0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  uVar9 = (ulong)idx;
  if (lVar5 != lVar4 && *(long *)((long)pvVar3 + 0x98) != *(long *)((long)pvVar3 + 0xa0)) {
    lVar8 = 0;
    do {
      uVar6 = (ulong)*(uint *)(*(long *)((long)pvVar3 + 0x98) + lVar8 * 4);
      if ((*(uint32_t *)(*(long *)((long)pvVar3 + 0x58) + uVar6 * 4) == idx) &&
         (*(int *)(lVar11 + uVar6 * 4) == 9999999)) {
        piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 8);
        *piVar1 = *piVar1 + 1;
      }
      if ((uVar9 <= n) &&
         (iVar12 = *(int *)(*(long *)((long)pvVar3 + 0x58) + uVar9 * 4),
         iVar12 == *(int *)(*(long *)((long)pvVar3 + 0x98) + lVar8 * 4))) {
        if (iVar12 == 0) {
          iVar12 = 0;
        }
        else {
          piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 4);
          *piVar1 = *piVar1 + 1;
          iVar12 = *(int *)(*(long *)((long)pvVar3 + 0x98) + lVar8 * 4);
        }
        if ((int)uVar7 != iVar12) {
          piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 8);
          *piVar1 = *piVar1 + 1;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar10 + (ulong)(lVar10 == 0) != lVar8);
  }
  if (uVar9 <= n + 1) {
    lVar11 = 0;
    uVar6 = uVar9;
    do {
      if ((uVar6 <= n) && ((int)uVar7 == *(int *)(*(long *)((long)pvVar3 + 0x58) + uVar6 * 4))) {
        piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 0x10);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 0xc);
        *piVar1 = *piVar1 + 1;
      }
      bVar13 = lVar11 != 0;
      lVar11 = lVar11 + -1;
      if ((bVar13) && (uVar6 == *(uint *)(*(long *)((long)pvVar3 + 0x58) + uVar7 * 4))) {
        piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 0xc);
        *piVar1 = *piVar1 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 <= n + 1);
  }
  uVar2 = *(uint *)(*(long *)((long)pvVar3 + 0x58) + uVar9 * 4);
  if ((idx < uVar2) || ((uVar2 == 0 && lVar5 != lVar4 && (**(int **)((long)pvVar3 + 0x98) != 0)))) {
    piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 8);
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

T* get_task_data()
  {
    return (T*)task_data;
  }